

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_mp_minmax(_func_void_mp_int_ptr_mp_int_ptr_mp_int_ptr *mp_minmax_into)

{
  ulong uVar1;
  mp_int *x_00;
  mp_int *x_01;
  size_t sVar2;
  mp_int *pmVar3;
  mp_int *y;
  mp_int *x;
  ulong uStack_28;
  uint8_t lens [2];
  size_t i;
  mp_int *b;
  mp_int *a;
  _func_void_mp_int_ptr_mp_int_ptr_mp_int_ptr *mp_minmax_into_local;
  
  x_00 = mp_new(0x100);
  x_01 = mp_new(0x100);
  uStack_28 = 0;
  while( true ) {
    uVar1 = uStack_28;
    sVar2 = (*looplimit)(10);
    if (sVar2 <= uVar1) break;
    random_read((void *)((long)&x + 6),2);
    pmVar3 = mp_random_bits_fn((ulong)x._6_1_,random_read);
    mp_copy_into(x_00,pmVar3);
    mp_free(pmVar3);
    pmVar3 = mp_random_bits_fn((ulong)x._7_1_,random_read);
    mp_copy_into(x_00,pmVar3);
    mp_free(pmVar3);
    log_start();
    (*mp_minmax_into)(x_00,x_00,x_01);
    log_end();
    uStack_28 = uStack_28 + 1;
  }
  mp_free(x_00);
  mp_free(x_01);
  return;
}

Assistant:

static void test_mp_minmax(
    void (*mp_minmax_into)(mp_int *r, mp_int *x, mp_int *y))
{
    mp_int *a = mp_new(256), *b = mp_new(256);
    for (size_t i = 0; i < looplimit(10); i++) {
        uint8_t lens[2];
        random_read(lens, 2);
        mp_int *x = mp_random_bits(lens[0]);
        mp_copy_into(a, x);
        mp_free(x);
        mp_int *y = mp_random_bits(lens[1]);
        mp_copy_into(a, y);
        mp_free(y);
        log_start();
        mp_minmax_into(a, a, b);
        log_end();
    }
    mp_free(a);
    mp_free(b);
}